

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O2

pool_ptr<soul::Module> __thiscall
soul::Program::ProgramImpl::findModuleWithName(ProgramImpl *this,string *name)

{
  long *plVar1;
  __type_conflict1 _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long *plVar3;
  long lVar4;
  
  plVar3 = (long *)name[2]._M_dataplus._M_p;
  plVar1 = (long *)name[2]._M_string_length;
  lVar4 = 0;
  do {
    if (plVar3 == plVar1) {
LAB_001f7ebf:
      *(long *)this = lVar4;
      return (pool_ptr<soul::Module>)(Module *)this;
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*plVar3 + 0x30),in_RDX);
    if (_Var2) {
      lVar4 = *plVar3;
      goto LAB_001f7ebf;
    }
    plVar3 = plVar3 + 1;
  } while( true );
}

Assistant:

pool_ptr<Module> findModuleWithName (const std::string& name) const
    {
        for (auto& m : modules)
            if (m->fullName == name)
                return m;

        return {};
    }